

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node256.cpp
# Opt level: O2

Node256 * duckdb::Node256::GrowNode48(ART *art,Node *node256,Node *node48)

{
  Node48 *pNVar1;
  Node256 *pNVar2;
  long lVar3;
  
  pNVar1 = Node::Ref<duckdb::Node48>(art,(Node)(node48->super_IndexPointer).data,NODE_48);
  pNVar2 = New(art,node256);
  Node::SetGateStatus(node256,(GateStatus)((node48->super_IndexPointer).data >> 0x3f));
  pNVar2->count = (ushort)pNVar1->count;
  for (lVar3 = 1; lVar3 != 0x101; lVar3 = lVar3 + 1) {
    if ((ulong)pNVar1->child_index[lVar3 + -1] == 0x30) {
      pNVar2->children[lVar3 + -1].super_IndexPointer.data = 0;
    }
    else {
      pNVar2->children[lVar3 + -1].super_IndexPointer.data =
           pNVar1->children[pNVar1->child_index[lVar3 + -1]].super_IndexPointer.data;
    }
  }
  pNVar1->count = '\0';
  Node::Free(art,node48);
  return pNVar2;
}

Assistant:

Node256 &Node256::GrowNode48(ART &art, Node &node256, Node &node48) {
	auto &n48 = Node::Ref<Node48>(art, node48, NType::NODE_48);
	auto &n256 = New(art, node256);
	node256.SetGateStatus(node48.GetGateStatus());

	n256.count = n48.count;
	for (uint16_t i = 0; i < CAPACITY; i++) {
		if (n48.child_index[i] != Node48::EMPTY_MARKER) {
			n256.children[i] = n48.children[n48.child_index[i]];
		} else {
			n256.children[i].Clear();
		}
	}

	n48.count = 0;
	Node::Free(art, node48);
	return n256;
}